

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O2

int Saig_ManCexFirstFlopPi(Aig_Man_t *p,Aig_Man_t *pAbs)

{
  int iVar1;
  int i;
  
  if (pAbs->vCiNumsOrig == (Vec_Int_t *)0x0) {
    __assert_fail("pAbs->vCiNumsOrig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldRef.c"
                  ,0x8a,"int Saig_ManCexFirstFlopPi(Aig_Man_t *, Aig_Man_t *)");
  }
  i = 0;
  while( true ) {
    if (p->vCis->nSize <= i) {
      return -1;
    }
    Vec_PtrEntry(p->vCis,i);
    iVar1 = Vec_IntEntry(pAbs->vCiNumsOrig,i);
    if (p->nTruePis <= iVar1) break;
    i = i + 1;
  }
  return i;
}

Assistant:

int Saig_ManCexFirstFlopPi( Aig_Man_t * p, Aig_Man_t * pAbs )
{ 
    Aig_Obj_t * pObj;
    int i;
    assert( pAbs->vCiNumsOrig != NULL );
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( Vec_IntEntry(pAbs->vCiNumsOrig, i) >= Saig_ManPiNum(p) )
            return i;
    }
    return -1;
}